

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl(google::protobuf::(anonymous_namespace)::OptionsToInterpret*,bool)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum *in_R9;
  string local_118;
  string local_f8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  string_view local_78 [3];
  AlphaNum local_48;
  
  local_78[0] = NullSafeStringView(
                                  "Some options could not be correctly parsed using the proto descriptors compiled into this binary.\nUnparsed options: "
                                  );
  google::protobuf::Message::ShortDebugString_abi_cxx11_(&local_f8,(Message *)**(undefined8 **)this)
  ;
  local_a8.piece_._M_len = local_f8._M_string_length;
  local_a8.piece_._M_str = local_f8._M_dataplus._M_p;
  local_d8.piece_ = NullSafeStringView("\nParsing attempt:  ");
  google::protobuf::Message::ShortDebugString_abi_cxx11_
            (&local_118,(Message *)**(undefined8 **)(this + 8));
  local_48.piece_._M_len = local_118._M_string_length;
  local_48.piece_._M_str = local_118._M_dataplus._M_p;
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)local_78,&local_a8,&local_d8,&local_48,
                    in_R9);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}